

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void delete_edge(edge_t_conflict e)

{
  bb_t pbVar1;
  out_edge_t peVar2;
  out_edge_t peVar3;
  DLIST_LINK_out_edge_t *pDVar4;
  
  pbVar1 = e->src;
  peVar2 = (e->out_link).prev;
  if (peVar2 == (out_edge_t)0x0) {
    if ((pbVar1->out_edges).head != e) goto LAB_00137aa0;
    peVar3 = (e->out_link).next;
    (pbVar1->out_edges).head = peVar3;
  }
  else {
    peVar3 = (e->out_link).next;
    (peVar2->out_link).next = peVar3;
  }
  if (peVar3 == (out_edge_t)0x0) {
    if ((pbVar1->out_edges).tail != e) {
LAB_00137aa0:
      dlist_assert_fail("remove","out_edge_t");
    }
    pDVar4 = (DLIST_LINK_out_edge_t *)&(pbVar1->out_edges).tail;
  }
  else {
    pDVar4 = &peVar3->out_link;
  }
  pDVar4->prev = peVar2;
  (e->out_link).prev = (out_edge_t)0x0;
  (e->out_link).next = (out_edge_t)0x0;
  DLIST_in_edge_t_remove(&e->dst->in_edges,e);
  free(e);
  return;
}

Assistant:

static void delete_edge (edge_t e) {
  DLIST_REMOVE (out_edge_t, e->src->out_edges, e);
  DLIST_REMOVE (in_edge_t, e->dst->in_edges, e);
  free (e);
}